

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaKf.c
# Opt level: O1

void Kf_ManSaveResults(Kf_Cut_t **ppCuts,int nCuts,Kf_Cut_t *pCutBest,Vec_Int_t *vTemp)

{
  Kf_Cut_t *pKVar1;
  long lVar2;
  ulong uVar3;
  
  if (0x1e < nCuts - 1U) {
    __assert_fail("nCuts > 0 && nCuts < KF_CUT_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaKf.c"
                  ,0xce,"void Kf_ManSaveResults(Kf_Cut_t **, int, Kf_Cut_t *, Vec_Int_t *)");
  }
  vTemp->nSize = 0;
  Vec_IntPush(vTemp,nCuts);
  Vec_IntPush(vTemp,-1);
  if (0 < nCuts) {
    uVar3 = 0;
    do {
      pKVar1 = ppCuts[uVar3];
      if (pKVar1 == pCutBest) {
        if (vTemp->nSize < 2) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        vTemp->pArray[1] = vTemp->nSize;
      }
      Vec_IntPush(vTemp,pKVar1->nLeaves);
      pKVar1 = ppCuts[uVar3];
      if (0 < pKVar1->nLeaves) {
        lVar2 = 0;
        do {
          if (pKVar1->pLeaves[lVar2] < 0) {
            __assert_fail("Var >= 0 && !(c >> 1)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x12e,"int Abc_Var2Lit(int, int)");
          }
          Vec_IntPush(vTemp,pKVar1->pLeaves[lVar2] * 2);
          lVar2 = lVar2 + 1;
          pKVar1 = ppCuts[uVar3];
        } while (lVar2 < pKVar1->nLeaves);
      }
      Vec_IntPush(vTemp,pKVar1->iFunc);
      Vec_IntPush(vTemp,ppCuts[uVar3]->Delay);
      Vec_IntPush(vTemp,(int)ppCuts[uVar3]->Area);
      uVar3 = uVar3 + 1;
    } while (uVar3 != (uint)nCuts);
  }
  if (1 < vTemp->nSize) {
    if (0 < vTemp->pArray[1]) {
      return;
    }
    __assert_fail("Vec_IntEntry(vTemp, 1) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaKf.c"
                  ,0xdc,"void Kf_ManSaveResults(Kf_Cut_t **, int, Kf_Cut_t *, Vec_Int_t *)");
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

static inline void Kf_ManSaveResults( Kf_Cut_t ** ppCuts, int nCuts, Kf_Cut_t * pCutBest, Vec_Int_t * vTemp )
{
    int i, k;
    assert( nCuts > 0 && nCuts < KF_CUT_MAX );
    Kf_ManStoreStart( vTemp, nCuts );
    for ( i = 0; i < nCuts; i++ )
    {
        if ( ppCuts[i] == pCutBest )
            Vec_IntWriteEntry( vTemp, 1, Vec_IntSize(vTemp) );
        Vec_IntPush( vTemp, ppCuts[i]->nLeaves );
//        Vec_IntPushArray( vTemp, ppCuts[i]->pLeaves, ppCuts[i]->nLeaves );
        for ( k = 0; k < ppCuts[i]->nLeaves; k++ )
            Vec_IntPush( vTemp, Abc_Var2Lit(ppCuts[i]->pLeaves[k], 0) );
        Vec_IntPush( vTemp, ppCuts[i]->iFunc );
        Vec_IntPush( vTemp, ppCuts[i]->Delay );
        Vec_IntPush( vTemp, Abc_Float2Int(ppCuts[i]->Area) );
    }
    assert( Vec_IntEntry(vTemp, 1) > 0 );
}